

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_texture_npatch
               (rf_texture2d texture,rf_npatch_info n_patch_info,rf_rec dest_rec,rf_vec2 origin,
               float rotation,rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  rf_npatch_info rVar10;
  rf_gfx_texcoord_data_type rVar11;
  rf_gfx_texcoord_data_type rVar12;
  rf_gfx_texcoord_data_type rVar13;
  rf_gfx_texcoord_data_type rVar14;
  rf_gfx_texcoord_data_type rVar15;
  rf_gfx_texcoord_data_type rVar16;
  rf_gfx_texcoord_data_type rVar17;
  rf_gfx_texcoord_data_type rVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float x;
  float y;
  float x_00;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined8 local_118;
  undefined8 local_108;
  float local_f8;
  float fStack_f4;
  undefined8 local_e8;
  undefined8 local_d8;
  float local_48;
  float fStack_44;
  undefined1 auVar34 [16];
  
  rVar10 = n_patch_info;
  if (texture.id == 0) {
    return;
  }
  if (n_patch_info.source_rec.width < 0.0) {
    n_patch_info.source_rec.x = n_patch_info.source_rec.x - n_patch_info.source_rec.width;
  }
  auVar29._0_4_ = (float)(-(uint)(0.0 < dest_rec.width) & (uint)dest_rec.width);
  auVar29._4_4_ = (float)(-(uint)(0.0 < dest_rec.height) & (uint)dest_rec.height);
  auVar29._8_4_ = -(uint)(0.0 < in_XMM1_Dc) & (uint)in_XMM1_Dc;
  auVar29._12_4_ = -(uint)(0.0 < in_XMM1_Dd) & (uint)in_XMM1_Dd;
  if (n_patch_info.source_rec.height < 0.0) {
    n_patch_info.source_rec.y = n_patch_info.source_rec.y - n_patch_info.source_rec.height;
  }
  auVar24._0_4_ = -(uint)(n_patch_info.type == 1);
  auVar24._4_4_ = -(uint)(n_patch_info.type == 2);
  auVar24._8_4_ = 0xffffffff;
  auVar24._12_4_ = 0xffffffff;
  auVar36._0_4_ = (uint)n_patch_info.source_rec.width & auVar24._0_4_;
  auVar36._4_4_ = (uint)n_patch_info.source_rec.height & auVar24._4_4_;
  auVar36._8_8_ = 0;
  auVar36 = auVar36 | ~auVar24 & auVar29;
  x = (float)rVar10.left;
  y = (float)rVar10.top;
  fVar37 = (float)rVar10.bottom;
  auVar31._0_4_ = x + (float)rVar10.right;
  auVar31._4_4_ = y + fVar37;
  auVar31._8_8_ = 0;
  auVar27._4_4_ = y;
  auVar27._0_4_ = x;
  auVar27._8_8_ = 0;
  auVar27 = divps(auVar27,auVar31);
  fVar26 = auVar36._0_4_;
  fVar25 = auVar27._0_4_ * fVar26;
  fVar19 = auVar36._4_4_;
  fVar28 = auVar27._4_4_ * fVar19;
  auVar35._4_4_ = -(uint)(auVar31._4_4_ < fVar19);
  auVar35._0_4_ = -(uint)(auVar31._0_4_ < fVar26);
  auVar35._8_4_ = -(uint)(0.0 < auVar36._8_4_);
  auVar35._12_4_ = -(uint)(0.0 < auVar36._12_4_);
  auVar35 = auVar35 | auVar24;
  fVar22 = (float)rVar10.right;
  if ((auVar35 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    fVar22 = fVar26 - fVar25;
  }
  fVar20 = (float)texture.width;
  fVar21 = (float)texture.height;
  auVar30._4_4_ = n_patch_info.source_rec.y;
  auVar30._0_4_ = n_patch_info.source_rec.x;
  if ((auVar35 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    fVar37 = fVar19 - fVar28;
  }
  auVar30._8_8_ = 0;
  auVar6._4_4_ = fVar21;
  auVar6._0_4_ = fVar20;
  auVar6._8_8_ = 0;
  auVar31 = divps(auVar30,auVar6);
  x_00 = (float)(~auVar35._0_4_ & (uint)fVar25 | (uint)x & auVar35._0_4_);
  fVar28 = (float)(~auVar35._4_4_ & (uint)fVar28 | (uint)y & auVar35._4_4_);
  fVar26 = fVar26 - fVar22;
  auVar32._0_4_ = n_patch_info.source_rec.x + x_00;
  auVar32._4_4_ = n_patch_info.source_rec.y + fVar28;
  auVar32._8_4_ = (float)(~auVar35._8_4_ & (uint)(auVar27._8_4_ * auVar36._8_4_)) + 0.0;
  auVar32._12_4_ = (float)(~auVar35._12_4_ & (uint)(auVar27._12_4_ * auVar36._12_4_)) + 0.0;
  auVar7._4_4_ = fVar21;
  auVar7._0_4_ = fVar20;
  auVar7._8_8_ = 0;
  auVar27 = divps(auVar32,auVar7);
  auVar33._0_4_ = n_patch_info.source_rec.x + n_patch_info.source_rec.width;
  fVar25 = n_patch_info.source_rec.height + n_patch_info.source_rec.y;
  auVar23._4_4_ = fVar25;
  auVar23._0_4_ = auVar33._0_4_ - fVar22;
  auVar23._8_8_ = 0;
  auVar34._4_8_ = 0;
  auVar34._0_4_ = auVar33._0_4_;
  auVar34._12_4_ = fVar25;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._4_4_ = fVar25 - fVar37;
  auVar8._4_4_ = fVar21;
  auVar8._0_4_ = fVar20;
  auVar8._8_8_ = 0;
  auVar36 = divps(auVar33,auVar8);
  auVar9._4_4_ = fVar21;
  auVar9._0_4_ = fVar20;
  auVar9._8_8_ = 0;
  auVar24 = divps(auVar23,auVar9);
  rf_gfx_enable_texture(texture.id);
  rf_gfx_push_matrix();
  local_48 = dest_rec.x;
  fStack_44 = dest_rec.y;
  rf_gfx_translatef(local_48,fStack_44,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  local_f8 = origin.x;
  fStack_f4 = origin.y;
  rf_gfx_translatef(-local_f8,-fStack_f4,0.0);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  local_d8._0_4_ = auVar31._0_4_;
  rVar17 = (rf_gfx_texcoord_data_type)local_d8;
  local_108._4_4_ = auVar24._4_4_;
  rVar14 = local_108._4_4_;
  local_108._0_4_ = auVar24._0_4_;
  rVar13 = (rf_gfx_texcoord_data_type)local_108;
  local_108 = auVar24._0_8_;
  local_e8._0_4_ = auVar36._0_4_;
  rVar15 = (rf_gfx_texcoord_data_type)local_e8;
  local_118._0_4_ = auVar27._0_4_;
  rVar11 = (rf_gfx_texcoord_data_type)local_118;
  local_d8._4_4_ = auVar31._4_4_;
  rVar18 = local_d8._4_4_;
  local_d8 = auVar31._0_8_;
  if (n_patch_info.type == 2) {
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = rVar17;
    prVar5[iVar1 * 2 + 1] = rVar14;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,n_patch_info.source_rec.height,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_118;
    prVar5[iVar1 * 2 + 1] = rVar14;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(x_00,n_patch_info.source_rec.height,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_118;
    prVar5[iVar1 * 2 + 1] = rVar18;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(x_00,0.0,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_d8;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
    if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_118;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x,n_patch_info.source_rec.height,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_108;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(fVar26,n_patch_info.source_rec.height,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar13;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(fVar26,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_118;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
    }
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    iVar1 = prVar4[lVar3].tc_counter;
    *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_108;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(fVar26,n_patch_info.source_rec.height,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_e8;
    prVar5[iVar1 * 2 + 1] = rVar14;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(auVar29._0_4_,n_patch_info.source_rec.height,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = (rf_gfx_texcoord_data_type)local_e8;
    prVar5[iVar1 * 2 + 1] = rVar18;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    rf_gfx_vertex3f(auVar29._0_4_,0.0,prVar2->current_depth);
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->current_buffer;
    prVar4 = prVar2->vertex_buffers;
    prVar5 = prVar4[lVar3].texcoords;
    iVar1 = prVar4[lVar3].tc_counter;
    prVar5[(long)iVar1 * 2] = rVar13;
    prVar5[iVar1 * 2 + 1] = rVar18;
    prVar4[lVar3].tc_counter = iVar1 + 1;
    fVar37 = prVar2->current_depth;
    fVar19 = 0.0;
  }
  else {
    fVar19 = fVar19 - fVar37;
    local_118._4_4_ = auVar27._4_4_;
    rVar12 = local_118._4_4_;
    local_e8._4_4_ = auVar36._4_4_;
    rVar16 = local_e8._4_4_;
    local_e8 = auVar36._0_8_;
    if (n_patch_info.type == 1) {
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = local_118._4_4_;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = local_118._4_4_;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(n_patch_info.source_rec.width,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(n_patch_info.source_rec.width,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_d8;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar17;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(0.0,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        iVar1 = prVar4[lVar3].tc_counter;
        *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_e8;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(n_patch_info.source_rec.width,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar15;
        prVar5[iVar1 * 2 + 1] = local_118._4_4_;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(n_patch_info.source_rec.width,fVar28,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar17;
        prVar5[iVar1 * 2 + 1] = local_118._4_4_;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(0.0,fVar28,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(n_patch_info.source_rec.width,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_e8;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(n_patch_info.source_rec.width,fVar19,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = rVar16;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      fVar37 = prVar2->current_depth;
      fVar26 = 0.0;
    }
    else {
      if (n_patch_info.type != 0) goto LAB_0014c90c;
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = local_118._4_4_;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      local_118 = auVar27._0_8_;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_118;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x_00,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar11;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x_00,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_d8;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,0.0,prVar2->current_depth);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        iVar1 = prVar4[lVar3].tc_counter;
        *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_118;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x,fVar28,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar13;
        prVar5[iVar1 * 2 + 1] = rVar12;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,fVar28,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar13;
        prVar5[iVar1 * 2 + 1] = rVar18;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,0.0,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar11;
        prVar5[iVar1 * 2 + 1] = rVar18;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x,0.0,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar13;
      prVar5[iVar1 * 2 + 1] = rVar12;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(fVar26,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = rVar12;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(auVar29._0_4_,fVar28,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(auVar29._0_4_,0.0,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar13;
      prVar5[iVar1 * 2 + 1] = rVar18;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(fVar26,0.0,prVar2->current_depth);
      if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar17;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(0.0,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar11;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x_00,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        iVar1 = prVar4[lVar3].tc_counter;
        *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_118;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x_00,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar17;
        prVar5[iVar1 * 2 + 1] = rVar12;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(0.0,y,prVar2->current_depth);
        if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = rVar11;
          prVar5[iVar1 * 2 + 1] = rVar16;
          prVar4[lVar3].tc_counter = iVar1 + 1;
          rf_gfx_vertex3f(x,fVar19,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = rVar13;
          prVar5[iVar1 * 2 + 1] = rVar16;
          prVar4[lVar3].tc_counter = iVar1 + 1;
          rf_gfx_vertex3f(fVar26,fVar19,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          prVar5 = prVar4[lVar3].texcoords;
          iVar1 = prVar4[lVar3].tc_counter;
          prVar5[(long)iVar1 * 2] = rVar13;
          prVar5[iVar1 * 2 + 1] = rVar12;
          prVar4[lVar3].tc_counter = iVar1 + 1;
          rf_gfx_vertex3f(fVar26,y,prVar2->current_depth);
          prVar2 = (rf__ctx->field_0).current_batch;
          lVar3 = prVar2->current_buffer;
          prVar4 = prVar2->vertex_buffers;
          iVar1 = prVar4[lVar3].tc_counter;
          *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_118;
          prVar4[lVar3].tc_counter = iVar1 + 1;
          rf_gfx_vertex3f(x,y,prVar2->current_depth);
        }
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar13;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        iVar1 = prVar4[lVar3].tc_counter;
        *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_e8;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(auVar29._0_4_,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar15;
        prVar5[iVar1 * 2 + 1] = rVar12;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(auVar29._0_4_,y,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar13;
        prVar5[iVar1 * 2 + 1] = rVar12;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,y,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar11;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x_00,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar11;
      prVar5[iVar1 * 2 + 1] = rVar16;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(x_00,fVar19,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar17;
      prVar5[iVar1 * 2 + 1] = rVar16;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(0.0,fVar19,prVar2->current_depth);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar11;
        prVar5[iVar1 * 2 + 1] = rVar14;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x,auVar29._4_4_,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        iVar1 = prVar4[lVar3].tc_counter;
        *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_108;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,auVar29._4_4_,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar13;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(fVar26,fVar19,prVar2->current_depth);
        prVar2 = (rf__ctx->field_0).current_batch;
        lVar3 = prVar2->current_buffer;
        prVar4 = prVar2->vertex_buffers;
        prVar5 = prVar4[lVar3].texcoords;
        iVar1 = prVar4[lVar3].tc_counter;
        prVar5[(long)iVar1 * 2] = rVar11;
        prVar5[iVar1 * 2 + 1] = rVar16;
        prVar4[lVar3].tc_counter = iVar1 + 1;
        rf_gfx_vertex3f(x,fVar19,prVar2->current_depth);
      }
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_108;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(fVar26,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar15;
      prVar5[iVar1 * 2 + 1] = rVar14;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(auVar29._0_4_,auVar29._4_4_,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      iVar1 = prVar4[lVar3].tc_counter;
      *(undefined8 *)(prVar4[lVar3].texcoords + (long)iVar1 * 2) = local_e8;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      rf_gfx_vertex3f(auVar29._0_4_,fVar19,prVar2->current_depth);
      prVar2 = (rf__ctx->field_0).current_batch;
      lVar3 = prVar2->current_buffer;
      prVar4 = prVar2->vertex_buffers;
      prVar5 = prVar4[lVar3].texcoords;
      iVar1 = prVar4[lVar3].tc_counter;
      prVar5[(long)iVar1 * 2] = rVar13;
      prVar5[iVar1 * 2 + 1] = rVar16;
      prVar4[lVar3].tc_counter = iVar1 + 1;
      fVar37 = prVar2->current_depth;
    }
  }
  rf_gfx_vertex3f(fVar26,fVar19,fVar37);
LAB_0014c90c:
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_texture_npatch(rf_texture2d texture, rf_npatch_info n_patch_info, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patch_width = (dest_rec.width <= 0.0f)? 0.0f : dest_rec.width;
        float patch_height = (dest_rec.height <= 0.0f)? 0.0f : dest_rec.height;

        if (n_patch_info.source_rec.width < 0) n_patch_info.source_rec.x -= n_patch_info.source_rec.width;
        if (n_patch_info.source_rec.height < 0) n_patch_info.source_rec.y -= n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL) patch_height = n_patch_info.source_rec.height;
        if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL) patch_width = n_patch_info.source_rec.width;

        bool draw_center = true;
        bool draw_middle = true;
        float left_border = (float)n_patch_info.left;
        float top_border = (float)n_patch_info.top;
        float right_border = (float)n_patch_info.right;
        float bottom_border = (float)n_patch_info.bottom;

        // adjust the lateral (left and right) border widths in case patch_width < texture.width
        if (patch_width <= (left_border + right_border) && n_patch_info.type != RF_NPT_3PATCH_VERTICAL)
        {
            draw_center = false;
            left_border = (left_border / (left_border + right_border)) * patch_width;
            right_border = patch_width - left_border;
        }
        // adjust the lateral (top and bottom) border heights in case patch_height < texture.height
        if (patch_height <= (top_border + bottom_border) && n_patch_info.type != RF_NPT_3PATCH_HORIZONTAL)
        {
            draw_middle = false;
            top_border = (top_border / (top_border + bottom_border)) * patch_height;
            bottom_border = patch_height - top_border;
        }

        rf_vec2 vert_a, vert_b, vert_c, vert_d;
        vert_a.x = 0.0f; // outer left
        vert_a.y = 0.0f; // outer top
        vert_b.x = left_border; // inner left
        vert_b.y = top_border; // inner top
        vert_c.x = patch_width - right_border; // inner right
        vert_c.y = patch_height - bottom_border; // inner bottom
        vert_d.x = patch_width; // outer right
        vert_d.y = patch_height; // outer bottom

        rf_vec2 coord_a, coord_b, coord_c, coord_d;
        coord_a.x = n_patch_info.source_rec.x / width;
        coord_a.y = n_patch_info.source_rec.y / height;
        coord_b.x = (n_patch_info.source_rec.x + left_border) / width;
        coord_b.y = (n_patch_info.source_rec.y + top_border) / height;
        coord_c.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width - right_border) / width;
        coord_c.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height - bottom_border) / height;
        coord_d.x = (n_patch_info.source_rec.x + n_patch_info.source_rec.width) / width;
        coord_d.y = (n_patch_info.source_rec.y + n_patch_info.source_rec.height) / height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
        rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
        rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
        rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
        rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

        if (n_patch_info.type == RF_NPT_9PATCH)
        {
            // ------------------------------------------------------------
            // TOP-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // TOP-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // TOP-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_middle)
            {
                // ------------------------------------------------------------
                // MIDDLE-LEFT QUAD
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
                if (draw_center)
                {
                    // MIDDLE-CENTER QUAD
                    rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Bottom-left corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-right corner for texture and quad
                    rf_gfx_tex_coord2f(coord_b.x, coord_b.y); rf_gfx_vertex2f(vert_b.x, vert_b.y); // Top-left corner for texture and quad
                }

                // MIDDLE-RIGHT QUAD
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_b.y); rf_gfx_vertex2f(vert_c.x, vert_b.y); // Top-left corner for texture and quad
            }

            // ------------------------------------------------------------
            // BOTTOM-LEFT QUAD
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // BOTTOM-CENTER QUAD
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_c.y); rf_gfx_vertex2f(vert_b.x, vert_c.y); // Top-left corner for texture and quad
            }

            // BOTTOM-RIGHT QUAD
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_c.y); rf_gfx_vertex2f(vert_c.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_VERTICAL)
        {
            // TOP QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // MIDDLE QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_d.x, coord_b.y); rf_gfx_vertex2f(vert_d.x, vert_b.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_a.x, coord_b.y); rf_gfx_vertex2f(vert_a.x, vert_b.y); // Top-left corner for texture and quad
            }
            // BOTTOM QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_c.y); rf_gfx_vertex2f(vert_d.x, vert_c.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_c.y); rf_gfx_vertex2f(vert_a.x, vert_c.y); // Top-left corner for texture and quad
        }
        else if (n_patch_info.type == RF_NPT_3PATCH_HORIZONTAL)
        {
            // LEFT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_a.x, coord_d.y); rf_gfx_vertex2f(vert_a.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_a.x, coord_a.y); rf_gfx_vertex2f(vert_a.x, vert_a.y); // Top-left corner for texture and quad
            if (draw_center)
            {
                // CENTER QUAD
                // -----------------------------------------------------------
                // rf_texture coords                 Vertices
                rf_gfx_tex_coord2f(coord_b.x, coord_d.y); rf_gfx_vertex2f(vert_b.x, vert_d.y); // Bottom-left corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-right corner for texture and quad
                rf_gfx_tex_coord2f(coord_b.x, coord_a.y); rf_gfx_vertex2f(vert_b.x, vert_a.y); // Top-left corner for texture and quad
            }
            // RIGHT QUAD
            // -----------------------------------------------------------
            // rf_texture coords                 Vertices
            rf_gfx_tex_coord2f(coord_c.x, coord_d.y); rf_gfx_vertex2f(vert_c.x, vert_d.y); // Bottom-left corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_d.y); rf_gfx_vertex2f(vert_d.x, vert_d.y); // Bottom-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_d.x, coord_a.y); rf_gfx_vertex2f(vert_d.x, vert_a.y); // Top-right corner for texture and quad
            rf_gfx_tex_coord2f(coord_c.x, coord_a.y); rf_gfx_vertex2f(vert_c.x, vert_a.y); // Top-left corner for texture and quad
        }
        rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();

    }
}